

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86internal.cpp
# Opt level: O0

Error asmjit::X86Internal::emitRegMove
                (X86Emitter *emitter,Operand_ *dst_,Operand_ *src_,uint32_t typeId,bool avxEnabled,
                char *comment)

{
  byte bVar1;
  uint in_ECX;
  undefined8 *in_RDX;
  uint64_t *in_RSI;
  long in_RDI;
  byte in_R8B;
  undefined8 in_R9;
  uint32_t elementTypeId;
  uint32_t memFlags;
  uint32_t instId;
  Operand src;
  Operand dst;
  char *in_stack_000001f0;
  int in_stack_000001fc;
  char *in_stack_00000200;
  undefined6 in_stack_fffffffffffffdf8;
  undefined1 in_stack_fffffffffffffdfe;
  undefined1 in_stack_fffffffffffffdff;
  uint in_stack_fffffffffffffe0c;
  CodeEmitter *in_stack_fffffffffffffe10;
  uint local_1c0;
  int local_1bc;
  CodeEmitter local_1b8;
  uint64_t *local_138;
  CodeEmitter *local_130;
  uint64_t *local_128;
  uint local_11c;
  CodeEmitter *local_118;
  uint local_10c;
  uint64_t *local_108;
  uint64_t *local_100;
  CodeEmitter *local_f8;
  undefined4 local_ec;
  CodeEmitter *local_e8;
  undefined4 local_dc;
  uint64_t *local_d8;
  undefined4 local_cc;
  uint64_t *local_c8;
  anon_union_8_2_78723da6_for_MemData_2 local_98;
  uint64_t *local_88;
  uint64_t *local_80;
  CodeEmitter *local_78;
  undefined4 local_70;
  undefined4 local_6c;
  CodeEmitter *local_68;
  undefined4 local_60;
  undefined4 local_5c;
  uint64_t *local_58;
  undefined4 local_50;
  undefined4 local_4c;
  CodeEmitter *local_48;
  undefined4 local_40;
  undefined4 local_3c;
  uint64_t *local_38;
  undefined4 local_2c;
  undefined4 local_28;
  uint local_24;
  uint64_t *local_20;
  undefined4 local_14;
  undefined4 local_10;
  uint local_c;
  CodeEmitter *local_8;
  
  local_1b8._reserved = in_R8B & 1;
  if (in_ECX < 0x20 || (100 < in_ECX || in_ECX < 0x22)) {
    DebugUtils::assertionFailed(in_stack_00000200,in_stack_000001fc,in_stack_000001f0);
  }
  local_1b8._none.field_0._mem.field_2 =
       (anon_union_8_2_78723da6_for_MemData_2)&local_1b8._codeInfo._baseAddress;
  local_1b8._codeInfo._baseAddress = *in_RSI;
  local_1b8._code = (CodeHolder *)in_RSI[1];
  local_1b8._nativeGpReg.super_Operand.super_Operand_.field_0._mem.field_2 =
       (anon_union_8_2_78723da6_for_MemData_2)&local_1b8;
  local_1b8._vptr_CodeEmitter = (_func_int **)*in_RDX;
  local_1b8._codeInfo._0_8_ = in_RDX[1];
  local_1c0 = 0;
  local_138 = &local_1b8._codeInfo._baseAddress;
  local_5c = 7;
  local_60 = 0;
  local_98.offset64 =
       (uint64_t)local_1b8._nativeGpReg.super_Operand.super_Operand_.field_0._mem.field_2;
  local_88 = (uint64_t *)local_1b8._none.field_0._mem.field_2;
  local_80 = local_138;
  local_58 = local_138;
  if (((uint)local_1b8._codeInfo._baseAddress & 7) == 2) {
    local_1c0 = 1;
    local_128 = &local_1b8._codeInfo._baseAddress;
    local_f8 = &local_1b8;
    local_4c = 0xff;
    local_50 = 0x18;
    local_10c = (uint)local_1b8._vptr_CodeEmitter >> 0x18;
    local_28 = 0xff;
    local_2c = 0x18;
    local_108 = local_128;
    local_48 = local_f8;
    local_24 = local_10c;
    local_20 = local_128;
    if (0xff < local_10c) {
      DebugUtils::assertionFailed(in_stack_00000200,in_stack_000001fc,in_stack_000001f0);
    }
    local_1b8._codeInfo._baseAddress._4_4_ = (undefined4)(local_1b8._codeInfo._baseAddress >> 0x20);
    local_1b8._codeInfo._baseAddress =
         CONCAT44(local_1b8._codeInfo._baseAddress._4_4_,
                  (uint)local_1b8._codeInfo._baseAddress & 0xffffff | local_10c << 0x18);
  }
  local_1b8._nativeGpArray = (Reg *)&local_1b8;
  local_6c = 7;
  local_70 = 0;
  local_78 = (CodeEmitter *)local_1b8._nativeGpArray;
  local_68 = (CodeEmitter *)local_1b8._nativeGpArray;
  if (((uint)local_1b8._vptr_CodeEmitter & 7) == 2) {
    local_1c0 = local_1c0 | 2;
    in_stack_fffffffffffffe10 = &local_1b8;
    local_100 = &local_1b8._codeInfo._baseAddress;
    local_3c = 0xff;
    local_40 = 0x18;
    local_11c = (uint)local_1b8._codeInfo._baseAddress >> 0x18;
    local_10 = 0xff;
    local_14 = 0x18;
    local_130 = in_stack_fffffffffffffe10;
    local_118 = in_stack_fffffffffffffe10;
    local_38 = local_100;
    local_c = local_11c;
    local_8 = in_stack_fffffffffffffe10;
    if (0xff < local_11c) {
      DebugUtils::assertionFailed(in_stack_00000200,in_stack_000001fc,in_stack_000001f0);
    }
    in_stack_fffffffffffffe0c = (uint)local_1b8._vptr_CodeEmitter & 0xffffff;
    local_1b8._vptr_CodeEmitter._4_4_ = (undefined4)((ulong)local_1b8._vptr_CodeEmitter >> 0x20);
    local_1b8._vptr_CodeEmitter =
         (_func_int **)
         CONCAT44(local_1b8._vptr_CodeEmitter._4_4_,in_stack_fffffffffffffe0c | local_11c << 0x18);
  }
  switch((Operand_ *)(ulong)(in_ECX - 0x22)) {
  case (Operand_ *)0x0:
  case (Operand_ *)0x1:
  case (Operand_ *)0x2:
  case (Operand_ *)0x3:
    if ((local_1c0 & 2) == 0) {
      if (local_1c0 == 0) {
        local_d8 = &local_1b8._codeInfo._baseAddress;
        local_dc = 0x4000029;
        local_1b8._codeInfo._baseAddress =
             CONCAT44(local_1b8._codeInfo._baseAddress._4_4_,0x4000029);
        local_e8 = &local_1b8;
        local_ec = 0x4000029;
        local_1b8._vptr_CodeEmitter =
             (_func_int **)CONCAT44(local_1b8._vptr_CodeEmitter._4_4_,0x4000029);
      }
    }
    else {
      local_c8 = &local_1b8._codeInfo._baseAddress;
      local_cc = 0x4000029;
      local_1b8._codeInfo._baseAddress = CONCAT44(local_1b8._codeInfo._baseAddress._4_4_,0x4000029);
    }
  case (Operand_ *)0x4:
  case (Operand_ *)0x5:
  case (Operand_ *)0x6:
  case (Operand_ *)0x7:
    local_1bc = 0x189;
    break;
  default:
    if (0x7f < in_ECX) {
      DebugUtils::assertionFailed(in_stack_00000200,in_stack_000001fc,in_stack_000001f0);
    }
    bVar1 = TypeId::_info[(ulong)in_ECX + 0x80];
    in_stack_fffffffffffffdff = 0x32 < in_ECX && in_ECX < 0x3d;
    if ((0x32 < in_ECX && in_ECX < 0x3d) && (local_1c0 != 0)) {
      if (bVar1 == 0x2a) {
        local_1bc = 0x1a8;
        if (local_1b8._reserved != 0) {
          local_1bc = 0x3f9;
        }
      }
      else {
        local_1bc = 0x18d;
        if (local_1b8._reserved != 0) {
          local_1bc = 0x3df;
        }
      }
    }
    else {
      in_stack_fffffffffffffdfe = 0x3c < in_ECX && in_ECX < 0x47;
      if ((0x3c < in_ECX && in_ECX < 0x47) && (local_1c0 != 0)) {
        if (bVar1 == 0x2b) {
          local_1bc = 0x1a5;
          if (local_1b8._reserved != 0) {
            local_1bc = 0x3f6;
          }
        }
        else {
          local_1bc = 0x1a2;
          if (local_1b8._reserved != 0) {
            local_1bc = 0x3f5;
          }
        }
      }
      else if (bVar1 == 0x2a) {
        local_1bc = 0x18b;
        if (local_1b8._reserved != 0) {
          local_1bc = 0x3de;
        }
      }
      else if (bVar1 == 0x2b) {
        local_1bc = 0x18a;
        if (local_1b8._reserved != 0) {
          local_1bc = 0x3dd;
        }
      }
      else if (in_ECX < 0x5b) {
        local_1bc = 400;
        if (local_1b8._reserved != 0) {
          local_1bc = 0x3e1;
        }
      }
      else if (bVar1 < 0x28) {
        local_1bc = 0x3e2;
      }
      else {
        local_1bc = 0x3e3;
      }
    }
    break;
  case (Operand_ *)0xb:
    local_1bc = 0x13f;
    break;
  case (Operand_ *)0xc:
    local_1bc = 0x142;
    break;
  case (Operand_ *)0xd:
    local_1bc = 0x140;
    break;
  case (Operand_ *)0xe:
    local_1bc = 0x141;
    break;
  case (Operand_ *)0xf:
    local_1bc = 0x18d;
    if (local_1c0 != 0) break;
  case (Operand_ *)0x10:
    local_1bc = 0x1a2;
  }
  if (local_1bc == 0) {
    local_1b8._extraOp.field_0._any.signature = 4;
  }
  else {
    *(undefined8 *)(in_RDI + 0x40) = in_R9;
    local_1b8._extraOp.field_0._any.signature =
         CodeEmitter::emit(in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c,
                           (Operand_ *)(ulong)(in_ECX - 0x22),
                           (Operand_ *)
                           CONCAT17(in_stack_fffffffffffffdff,
                                    CONCAT16(in_stack_fffffffffffffdfe,in_stack_fffffffffffffdf8)));
  }
  return local_1b8._extraOp.field_0._any.signature;
}

Assistant:

ASMJIT_FAVOR_SIZE Error X86Internal::emitRegMove(X86Emitter* emitter,
  const Operand_& dst_,
  const Operand_& src_, uint32_t typeId, bool avxEnabled, const char* comment) {

  // Invalid or abstract TypeIds are not allowed.
  ASMJIT_ASSERT(TypeId::isValid(typeId) && !TypeId::isAbstract(typeId));

  Operand dst(dst_);
  Operand src(src_);

  uint32_t instId = Globals::kInvalidInstId;
  uint32_t memFlags = 0;

  enum MemFlags {
    kDstMem = 0x1,
    kSrcMem = 0x2
  };

  // Detect memory operands and patch them to have the same size as the register.
  // CodeCompiler always sets memory size of allocs and spills, so it shouldn't
  // be really necessary, however, after this function was separated from Compiler
  // it's better to make sure that the size is always specified, as we can use
  // 'movzx' and 'movsx' that rely on it.
  if (dst.isMem()) { memFlags |= kDstMem; dst.as<X86Mem>().setSize(src.getSize()); }
  if (src.isMem()) { memFlags |= kSrcMem; src.as<X86Mem>().setSize(dst.getSize()); }

  switch (typeId) {
    case TypeId::kI8:
    case TypeId::kU8:
    case TypeId::kI16:
    case TypeId::kU16:
      // Special case - 'movzx' load.
      if (memFlags & kSrcMem) {
        instId = X86Inst::kIdMovzx;
        dst.setSignature(X86RegTraits<X86Reg::kRegGpd>::kSignature);
      }
      else if (!memFlags) {
        // Change both destination and source registers to GPD (safer, no dependencies).
        dst.setSignature(X86RegTraits<X86Reg::kRegGpd>::kSignature);
        src.setSignature(X86RegTraits<X86Reg::kRegGpd>::kSignature);
      }
      ASMJIT_FALLTHROUGH;

    case TypeId::kI32:
    case TypeId::kU32:
    case TypeId::kI64:
    case TypeId::kU64:
      instId = X86Inst::kIdMov;
      break;

    case TypeId::kMmx32:
      instId = X86Inst::kIdMovd;
      if (memFlags) break;
      ASMJIT_FALLTHROUGH;
    case TypeId::kMmx64 : instId = X86Inst::kIdMovq ; break;
    case TypeId::kMask8 : instId = X86Inst::kIdKmovb; break;
    case TypeId::kMask16: instId = X86Inst::kIdKmovw; break;
    case TypeId::kMask32: instId = X86Inst::kIdKmovd; break;
    case TypeId::kMask64: instId = X86Inst::kIdKmovq; break;

    default: {
      uint32_t elementTypeId = TypeId::elementOf(typeId);
      if (TypeId::isVec32(typeId) && memFlags) {
        if (elementTypeId == TypeId::kF32)
          instId = avxEnabled ? X86Inst::kIdVmovss : X86Inst::kIdMovss;
        else
          instId = avxEnabled ? X86Inst::kIdVmovd : X86Inst::kIdMovd;
        break;
      }

      if (TypeId::isVec64(typeId) && memFlags) {
        if (elementTypeId == TypeId::kF64)
          instId = avxEnabled ? X86Inst::kIdVmovsd : X86Inst::kIdMovsd;
        else
          instId = avxEnabled ? X86Inst::kIdVmovq : X86Inst::kIdMovq;
        break;
      }

      if (elementTypeId == TypeId::kF32)
        instId = avxEnabled ? X86Inst::kIdVmovaps : X86Inst::kIdMovaps;
      else if (elementTypeId == TypeId::kF64)
        instId = avxEnabled ? X86Inst::kIdVmovapd : X86Inst::kIdMovapd;
      else if (typeId <= TypeId::_kVec256End)
        instId = avxEnabled ? X86Inst::kIdVmovdqa : X86Inst::kIdMovdqa;
      else if (elementTypeId <= TypeId::kU32)
        instId = X86Inst::kIdVmovdqa32;
      else
        instId = X86Inst::kIdVmovdqa64;
      break;
    }
  }

  if (!instId)
    return DebugUtils::errored(kErrorInvalidState);

  emitter->setInlineComment(comment);
  return emitter->emit(instId, dst, src);
}